

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeemitter.cpp
# Opt level: O0

Error __thiscall
asmjit::CodeEmitter::_emitOpArray
          (CodeEmitter *this,uint32_t instId,Operand_ *opArray,size_t opCount)

{
  undefined8 in_RCX;
  long in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  Operand_ *op;
  Error local_8;
  
  switch(in_RCX) {
  case 0:
    local_8 = (**(code **)(*in_RDI + 0x20))
                        (in_RDI,in_ESI,in_RDI + 10,in_RDI + 10,in_RDI + 10,in_RDI + 10);
    break;
  case 1:
    local_8 = (**(code **)(*in_RDI + 0x20))
                        (in_RDI,in_ESI,in_RDX,in_RDI + 10,in_RDI + 10,in_RDI + 10);
    break;
  case 2:
    local_8 = (**(code **)(*in_RDI + 0x20))
                        (in_RDI,in_ESI,in_RDX,in_RDX + 0x10,in_RDI + 10,in_RDI + 10);
    break;
  case 3:
    local_8 = (**(code **)(*in_RDI + 0x20))
                        (in_RDI,in_ESI,in_RDX,in_RDX + 0x10,in_RDX + 0x20,in_RDI + 10);
    break;
  case 4:
    local_8 = (**(code **)(*in_RDI + 0x20))
                        (in_RDI,in_ESI,in_RDX,in_RDX + 0x10,in_RDX + 0x20,in_RDX + 0x30);
    break;
  case 5:
    local_8 = (**(code **)(*in_RDI + 0x28))
                        (in_RDI,in_ESI,in_RDX,in_RDX + 0x10,in_RDX + 0x20,in_RDX + 0x30,
                         in_RDX + 0x40,in_RDI + 10);
    break;
  case 6:
    local_8 = (**(code **)(*in_RDI + 0x28))
                        (in_RDI,in_ESI,in_RDX,in_RDX + 0x10,in_RDX + 0x20,in_RDX + 0x30,
                         in_RDX + 0x40,in_RDX + 0x50);
    break;
  default:
    local_8 = 3;
  }
  return local_8;
}

Assistant:

Error CodeEmitter::_emitOpArray(uint32_t instId, const Operand_* opArray, size_t opCount) {
  const Operand_* op = opArray;
  switch (opCount) {
    case 0: return _emit(instId, _none, _none, _none, _none);
    case 1: return _emit(instId, op[0], _none, _none, _none);
    case 2: return _emit(instId, op[0], op[1], _none, _none);
    case 3: return _emit(instId, op[0], op[1], op[2], _none);
    case 4: return _emit(instId, op[0], op[1], op[2], op[3]);
    case 5: return _emit(instId, op[0], op[1], op[2], op[3], op[4], _none);
    case 6: return _emit(instId, op[0], op[1], op[2], op[3], op[4], op[5]);

    default:
      return DebugUtils::errored(kErrorInvalidArgument);
  }
}